

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# escaping.cc
# Opt level: O0

bool __thiscall
absl::lts_20250127::HexStringToBytes
          (lts_20250127 *this,string_view hex,Nonnull<std::string_*> bytes)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  size_type sVar4;
  size_type sVar5;
  const_reference pvVar6;
  reference pcVar7;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_90;
  int local_88;
  int local_84;
  int h2;
  int h1;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_78;
  iterator bin_p;
  const_iterator hex_p;
  size_t num_bytes;
  string output;
  Nonnull<std::string_*> bytes_local;
  string_view hex_local;
  
  output.field_2._8_8_ = hex._M_str;
  hex_local._M_len = hex._M_len;
  bytes_local = (Nonnull<std::string_*>)this;
  std::__cxx11::string::string((string *)&num_bytes);
  sVar4 = std::basic_string_view<char,_std::char_traits<char>_>::size
                    ((basic_string_view<char,_std::char_traits<char>_> *)&bytes_local);
  sVar5 = std::basic_string_view<char,_std::char_traits<char>_>::size
                    ((basic_string_view<char,_std::char_traits<char>_> *)&bytes_local);
  if (sVar5 == (sVar4 >> 1) * 2) {
    strings_internal::STLStringResizeUninitialized<std::__cxx11::string,void>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&num_bytes,
               sVar4 >> 1);
    bin_p._M_current =
         std::basic_string_view<char,_std::char_traits<char>_>::cbegin
                   ((basic_string_view<char,_std::char_traits<char>_> *)&bytes_local);
    local_78._M_current = (char *)std::__cxx11::string::begin();
    while( true ) {
      _h2 = (char *)std::__cxx11::string::end();
      bVar2 = __gnu_cxx::operator!=
                        (&local_78,
                         (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&h2);
      if (!bVar2) break;
      cVar1 = *bin_p._M_current;
      bin_p._M_current = bin_p._M_current + 1;
      pvVar6 = std::array<signed_char,_256UL>::operator[]
                         ((array<signed_char,_256UL> *)(anonymous_namespace)::kHexValueStrict,
                          (long)cVar1);
      local_84 = (int)*pvVar6;
      cVar1 = *bin_p._M_current;
      bin_p._M_current = bin_p._M_current + 1;
      pvVar6 = std::array<signed_char,_256UL>::operator[]
                         ((array<signed_char,_256UL> *)(anonymous_namespace)::kHexValueStrict,
                          (long)cVar1);
      cVar1 = *pvVar6;
      local_88 = (int)cVar1;
      if ((local_84 == -1) || (local_88 == -1)) {
        local_90._M_current = (char *)std::__cxx11::string::begin();
        __gnu_cxx::operator-(&local_78,&local_90);
        std::__cxx11::string::resize((ulong)&num_bytes);
        hex_local._M_str._7_1_ = 0;
        goto LAB_008afe29;
      }
      iVar3 = local_84 << 4;
      pcVar7 = __gnu_cxx::
               __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&local_78);
      *pcVar7 = (char)iVar3 + cVar1;
      __gnu_cxx::
      __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&local_78);
    }
    std::__cxx11::string::operator=((string *)output.field_2._8_8_,(string *)&num_bytes);
    hex_local._M_str._7_1_ = 1;
  }
  else {
    hex_local._M_str._7_1_ = 0;
  }
LAB_008afe29:
  std::__cxx11::string::~string((string *)&num_bytes);
  return (bool)(hex_local._M_str._7_1_ & 1);
}

Assistant:

bool HexStringToBytes(absl::string_view hex,
                      absl::Nonnull<std::string*> bytes) {
  std::string output;

  size_t num_bytes = hex.size() / 2;
  if (hex.size() != num_bytes * 2) {
    return false;
  }

  absl::strings_internal::STLStringResizeUninitialized(&output, num_bytes);
  auto hex_p = hex.cbegin();
  for (std::string::iterator bin_p = output.begin(); bin_p != output.end();
       ++bin_p) {
    int h1 = absl::kHexValueStrict[static_cast<size_t>(*hex_p++)];
    int h2 = absl::kHexValueStrict[static_cast<size_t>(*hex_p++)];
    if (h1 == -1 || h2 == -1) {
      output.resize(static_cast<size_t>(bin_p - output.begin()));
      return false;
    }
    *bin_p = static_cast<char>((h1 << 4) + h2);
  }

  *bytes = std::move(output);
  return true;
}